

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<unsigned_short_(unsigned_short)>::Perform
          (Action<unsigned_short_(unsigned_short)> *this,ArgumentTuple *args)

{
  ActionInterface<unsigned_short_(unsigned_short)> *pAVar1;
  unsigned_short uVar2;
  int iVar3;
  _Manager_type p_Var4;
  
  p_Var4 = (this->fun_).super__Function_base._M_manager;
  if ((this->impl_).value_ == (ActionInterface<unsigned_short_(unsigned_short)> *)0x0 &&
      p_Var4 == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O2/_deps/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x193);
    p_Var4 = (this->fun_).super__Function_base._M_manager;
  }
  if (p_Var4 != (_Manager_type)0x0) {
    uVar2 = internal::
            ApplyImpl<std::function<unsigned_short(unsigned_short)>const&,std::tuple<unsigned_short>,0ul>
                      (this,args);
    return uVar2;
  }
  pAVar1 = (this->impl_).value_;
  iVar3 = (*pAVar1->_vptr_ActionInterface[2])(pAVar1,args);
  return (Result)iVar3;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
#if GTEST_LANG_CXX11
    if (fun_ != nullptr) {
      return internal::Apply(fun_, ::std::move(args));
    }
#endif
    return impl_->Perform(args);
  }